

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.c
# Opt level: O0

int SHA256_Final(uchar *md,SHA256_CTX *c)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  void *pvVar4;
  uint uVar5;
  int local_3c;
  sha2_word32 tmp_1;
  int j;
  sha2_word64 *ptr;
  sha2_word64 tmp;
  uint *puStack_20;
  uint usedspace;
  sha2_word32 *d;
  SHA256_CTX *context_local;
  sha2_byte *digest_local;
  
  if (c == (SHA256_CTX *)0x0) {
    __assert_fail("context != (SHA256_CTX*)0",
                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sha2.c",
                  0x236,"void SHA256_Final(sha2_byte *, SHA256_CTX *)");
  }
  if (md != (uchar *)0x0) {
    uVar1._0_4_ = c->Nl;
    uVar1._4_4_ = c->Nh;
    uVar2 = (uint)(uVar1 >> 3) & 0x3f;
    uVar3._0_4_ = c->Nl;
    uVar3._4_4_ = c->Nh;
    uVar3 = uVar3 >> 0x20 | uVar3 << 0x20;
    uVar3 = (uVar3 & 0xff00ff00ff00ff00) >> 8 | (uVar3 & 0xff00ff00ff00ff) << 8;
    uVar3 = (uVar3 & 0xffff0000ffff0000) >> 0x10 | (uVar3 & 0xffff0000ffff) << 0x10;
    c->Nl = (int)uVar3;
    c->Nh = (int)(uVar3 >> 0x20);
    if ((uVar1 >> 3 & 0x3f) == 0) {
      memset(c->data,0,0x38);
      *(undefined1 *)c->data = 0x80;
    }
    else {
      uVar5 = uVar2 + 1;
      *(undefined1 *)((long)c->data + (ulong)uVar2) = 0x80;
      if (uVar5 < 0x39) {
        memset((void *)((long)c->data + (ulong)uVar5),0,(ulong)(0x38 - uVar5));
      }
      else {
        if (uVar5 < 0x40) {
          memset((void *)((long)c->data + (ulong)uVar5),0,(ulong)(0x40 - uVar5));
        }
        SHA256_Transform((SHA256_CTX *)c,c->data);
        memset(c->data,0,0x38);
      }
    }
    uVar2 = c->Nh;
    c->data[0xe] = c->Nl;
    c->data[0xf] = uVar2;
    SHA256_Transform((SHA256_CTX *)c,c->data);
    puStack_20 = (uint *)md;
    for (local_3c = 0; local_3c < 8; local_3c = local_3c + 1) {
      uVar2 = c->h[local_3c] >> 0x10 | c->h[local_3c] << 0x10;
      c->h[local_3c] = uVar2 >> 8 & 0xff00ff | (uVar2 & 0xff00ff) << 8;
      *puStack_20 = c->h[local_3c];
      puStack_20 = puStack_20 + 1;
    }
  }
  pvVar4 = memset(c,0,0x68);
  return (int)pvVar4;
}

Assistant:

void SHA256_Final(sha2_byte digest[SHA256_DIGEST_LENGTH], SHA256_CTX* context) {
	sha2_word32	*d = (sha2_word32*)digest;
	unsigned int	usedspace;

	/* Sanity check: */
	assert(context != (SHA256_CTX*)0);

	/* If no digest buffer is passed, we don't bother doing this: */
	if (digest != (sha2_byte*)0) {
		usedspace = (context->bitcount >> 3) % SHA256_BLOCK_LENGTH;
#if BYTE_ORDER == LITTLE_ENDIAN
		/* Convert FROM host byte order */
		REVERSE64(context->bitcount,context->bitcount);
#endif
		if (usedspace > 0) {
			/* Begin padding with a 1 bit: */
			context->buffer[usedspace++] = 0x80;

			if (usedspace <= SHA256_SHORT_BLOCK_LENGTH) {
				/* Set-up for the last transform: */
				MEMSET_BZERO(&context->buffer[usedspace], SHA256_SHORT_BLOCK_LENGTH - usedspace);
			} else {
				if (usedspace < SHA256_BLOCK_LENGTH) {
					MEMSET_BZERO(&context->buffer[usedspace], SHA256_BLOCK_LENGTH - usedspace);
				}
				/* Do second-to-last transform: */
				SHA256_Transform(context, (sha2_word32*)context->buffer);

				/* And set-up for the last transform: */
				MEMSET_BZERO(context->buffer, SHA256_SHORT_BLOCK_LENGTH);
			}
		} else {
			/* Set-up for the last transform: */
			MEMSET_BZERO(context->buffer, SHA256_SHORT_BLOCK_LENGTH);

			/* Begin padding with a 1 bit: */
			*context->buffer = 0x80;
		}
		/* Set the bit count: */
        sha2_word64* ptr = (sha2_word64*)(&context->buffer[SHA256_SHORT_BLOCK_LENGTH]);
        *ptr = context->bitcount;

		/* Final transform: */
		SHA256_Transform(context, (sha2_word32*)context->buffer);

#if BYTE_ORDER == LITTLE_ENDIAN
		{
			/* Convert TO host byte order */
			int	j;
			for (j = 0; j < 8; j++) {
				REVERSE32(context->state[j],context->state[j]);
				*d++ = context->state[j];
			}
		}
#else
		MEMCPY_BCOPY(d, context->state, SHA256_DIGEST_LENGTH);
#endif
	}

	/* Clean up state data: */
	MEMSET_BZERO(context, sizeof(SHA256_CTX));
}